

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_url.c
# Opt level: O0

int amqp_parse_url(char *url,amqp_connection_info *parsed)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  undefined8 *in_RSI;
  char *in_RDI;
  long portnum;
  char *end;
  char *port;
  char *host;
  char *start;
  char delim;
  int res;
  char *local_38;
  char *local_30;
  char *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar5;
  int iVar6;
  
  iVar6 = -8;
  local_30 = (char *)0x0;
  iVar2 = strncmp(in_RDI,"amqp://",7);
  if (iVar2 != 0) {
    iVar2 = strncmp(in_RDI,"amqps://",8);
    if (iVar2 != 0) {
      return iVar6;
    }
    *(undefined4 *)(in_RSI + 4) = 0x1627;
    *(undefined4 *)((long)in_RSI + 0x24) = 1;
  }
  iVar2 = 7;
  if (*(int *)((long)in_RSI + 0x24) != 0) {
    iVar2 = 8;
  }
  pcVar3 = in_RDI + iVar2;
  iVar2 = (int)((ulong)pcVar3 >> 0x20);
  local_28 = pcVar3;
  cVar1 = find_delim((char **)CONCAT44(iVar6,in_stack_ffffffffffffffe8),iVar2);
  uVar5 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffe8);
  if (cVar1 == ':') {
    local_30 = pcVar3;
    cVar1 = find_delim((char **)CONCAT44(iVar6,uVar5),iVar2);
    uVar5 = CONCAT13(cVar1,(int3)uVar5);
  }
  if ((char)((uint)uVar5 >> 0x18) == '@') {
    *in_RSI = local_28;
    if (local_30 != (char *)0x0) {
      in_RSI[1] = local_30;
    }
    local_30 = (char *)0x0;
    local_28 = pcVar3;
    cVar1 = find_delim((char **)CONCAT44(iVar6,uVar5),iVar2);
    uVar5 = CONCAT13(cVar1,(int3)uVar5);
  }
  if ((char)((uint)uVar5 >> 0x18) == '[') {
    if (local_28 != pcVar3) {
      return iVar6;
    }
    if (*local_28 != '\0') {
      return iVar6;
    }
    cVar1 = find_delim((char **)CONCAT44(iVar6,uVar5),iVar2);
    uVar5 = CONCAT13(cVar1,(int3)uVar5);
    if (cVar1 != ']') {
      return iVar6;
    }
    in_RSI[2] = pcVar3;
    cVar1 = find_delim((char **)CONCAT44(iVar6,uVar5),iVar2);
    uVar5 = CONCAT13(cVar1,(int3)uVar5);
    if (*pcVar3 != '\0') {
      return iVar6;
    }
  }
  else if (*local_28 != '\0') {
    in_RSI[2] = local_28;
  }
  if ((char)((uint)uVar5 >> 0x18) == ':') {
    local_30 = pcVar3;
    cVar1 = find_delim((char **)CONCAT44(iVar6,uVar5),iVar2);
    uVar5 = CONCAT13(cVar1,(int3)uVar5);
  }
  if (local_30 != (char *)0x0) {
    lVar4 = strtol(local_30,&local_38,10);
    if (local_30 == local_38) {
      return iVar6;
    }
    if (*local_38 != '\0') {
      return iVar6;
    }
    if (lVar4 < 0) {
      return iVar6;
    }
    if (0xffff < lVar4) {
      return iVar6;
    }
    *(int *)(in_RSI + 4) = (int)lVar4;
  }
  cVar1 = (char)((uint)uVar5 >> 0x18);
  if (cVar1 == '/') {
    cVar1 = find_delim((char **)CONCAT44(iVar6,uVar5),iVar2);
    if (cVar1 == '\0') {
      in_RSI[3] = pcVar3;
      iVar6 = 0;
    }
  }
  else if (cVar1 == '\0') {
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int amqp_parse_url(char *url, struct amqp_connection_info *parsed)
{
  int res = AMQP_STATUS_BAD_URL;
  char delim;
  char *start;
  char *host;
  char *port = NULL;

  /* check the prefix */
  if (!strncmp(url, "amqp://", 7)) {
    /* do nothing */
  } else if (!strncmp(url, "amqps://", 8)) {
    parsed->port = 5671;
    parsed->ssl = 1;
  } else {
    goto out;
  }

  host = start = url += (parsed->ssl ? 8 : 7);
  delim = find_delim(&url, 1);

  if (delim == ':') {
    /* The colon could be introducing the port or the
       password part of the userinfo.  We don't know yet,
       so stash the preceding component. */
    port = start = url;
    delim = find_delim(&url, 1);
  }

  if (delim == '@') {
    /* What might have been the host and port were in fact
       the username and password */
    parsed->user = host;
    if (port) {
      parsed->password = port;
    }

    port = NULL;
    host = start = url;
    delim = find_delim(&url, 1);
  }

  if (delim == '[') {
    /* IPv6 address.  The bracket should be the first
       character in the host. */
    if (host != start || *host != 0) {
      goto out;
    }

    start = url;
    delim = find_delim(&url, 0);

    if (delim != ']') {
      goto out;
    }

    parsed->host = start;
    start = url;
    delim = find_delim(&url, 1);

    /* Closing bracket should be the last character in the
       host. */
    if (*start != 0) {
      goto out;
    }
  } else {
    /* If we haven't seen the host yet, this is it. */
    if (*host != 0) {
      parsed->host = host;
    }
  }

  if (delim == ':') {
    port = start = url;
    delim = find_delim(&url, 1);
  }

  if (port) {
    char *end;
    long portnum = strtol(port, &end, 10);

    if (port == end || *end != 0 || portnum < 0 || portnum > 65535) {
      goto out;
    }

    parsed->port = portnum;
  }

  if (delim == '/') {
    start = url;
    delim = find_delim(&url, 1);

    if (delim != 0) {
      goto out;
    }

    parsed->vhost = start;
    res = AMQP_STATUS_OK;
  } else if (delim == 0) {
    res = AMQP_STATUS_OK;
  }

  /* Any other delimiter is bad, and we will return
     AMQP_STATUS_BAD_AMQP_URL. */

out:
  return res;
}